

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

bool __thiscall OpenMD::MoleculeStamp::isBondInSameRigidBody(MoleculeStamp *this,BondStamp *bond)

{
  bool bVar1;
  BondStamp *in_RSI;
  undefined8 in_RDI;
  int consAtomB;
  int consAtomA;
  int rbB;
  int rbA;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int atomIndex;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  atomIndex = (int)((ulong)in_RDI >> 0x20);
  BondStamp::getA(in_RSI);
  bVar1 = isAtomInRigidBody((MoleculeStamp *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),atomIndex,
                            (int *)in_RSI,
                            (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    BondStamp::getB(in_RSI);
    bVar1 = isAtomInRigidBody((MoleculeStamp *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                              atomIndex,(int *)in_RSI,
                              (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (bVar1) {
      if (in_stack_ffffffffffffffe0 == in_stack_ffffffffffffffe4) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MoleculeStamp::isBondInSameRigidBody(BondStamp* bond) {
    int rbA;
    int rbB;
    int consAtomA;
    int consAtomB;

    if (!isAtomInRigidBody(bond->getA(), rbA, consAtomA)) return false;

    if (!isAtomInRigidBody(bond->getB(), rbB, consAtomB)) return false;

    if (rbB == rbA)
      return true;
    else
      return false;
  }